

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

xmlHashEntry *
xmlHashFindEntry(xmlHashTable *hash,xmlChar *key,xmlChar *key2,xmlChar *key3,uint hashValue,
                int *pfound)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int local_50;
  uint local_4c;
  int found;
  uint displ;
  uint pos;
  uint mask;
  xmlHashEntry *entry;
  int *pfound_local;
  uint hashValue_local;
  xmlChar *key3_local;
  xmlChar *key2_local;
  xmlChar *key_local;
  xmlHashTable *hash_local;
  
  local_50 = 0;
  uVar1 = hash->size - 1;
  found = hashValue & uVar1;
  _pos = hash->table + (uint)found;
  if (_pos->hashValue != 0) {
    local_4c = 0;
    do {
      if (_pos->hashValue == (hashValue | 0x80000000)) {
        if ((((hash->dict != (xmlDictPtr)0x0) && (_pos->key == key)) && (_pos->key2 == key2)) &&
           (_pos->key3 == key3)) {
          local_50 = 1;
          break;
        }
        iVar2 = strcmp((char *)_pos->key,(char *)key);
        if (((iVar2 == 0) && (iVar2 = xmlFastStrEqual(_pos->key2,key2), iVar2 != 0)) &&
           (iVar2 = xmlFastStrEqual(_pos->key3,key3), iVar2 != 0)) {
          local_50 = 1;
          break;
        }
      }
      local_4c = local_4c + 1;
      found = found + 1;
      _pos = _pos + 1;
      if ((found & uVar1) == 0) {
        _pos = hash->table;
      }
      bVar3 = false;
      if (_pos->hashValue != 0) {
        bVar3 = local_4c <= (found - _pos->hashValue & uVar1);
      }
    } while (bVar3);
  }
  *pfound = local_50;
  return _pos;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static xmlHashEntry *
xmlHashFindEntry(const xmlHashTable *hash, const xmlChar *key,
                 const xmlChar *key2, const xmlChar *key3,
                 unsigned hashValue, int *pfound) {
    xmlHashEntry *entry;
    unsigned mask, pos, displ;
    int found = 0;

    mask = hash->size - 1;
    pos = hashValue & mask;
    entry = &hash->table[pos];

    if (entry->hashValue != 0) {
        /*
         * Robin hood hashing: abort if the displacement of the entry
         * is smaller than the displacement of the key we look for.
         * This also stops at the correct position when inserting.
         */
        displ = 0;
        hashValue |= MAX_HASH_SIZE;

        do {
            if (entry->hashValue == hashValue) {
                if (hash->dict) {
                    if ((entry->key == key) &&
                        (entry->key2 == key2) &&
                        (entry->key3 == key3)) {
                        found = 1;
                        break;
                    }
                }
                if ((strcmp((const char *) entry->key,
                            (const char *) key) == 0) &&
                    (xmlFastStrEqual(entry->key2, key2)) &&
                    (xmlFastStrEqual(entry->key3, key3))) {
                    found = 1;
                    break;
                }
            }

            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = hash->table;
        } while ((entry->hashValue != 0) &&
                 (((pos - entry->hashValue) & mask) >= displ));
    }

    *pfound = found;
    return(entry);
}